

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  int *piVar1;
  uint16_t *ptr;
  char cVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  IRIns *pIVar6;
  TRef *pTVar7;
  TValue *pTVar8;
  IRRef1 IVar9;
  int iVar10;
  TRef TVar11;
  TRef TVar12;
  BCReg func;
  cTValue *pcVar13;
  cTValue *pcVar14;
  uint uVar15;
  long lVar16;
  uint8_t uVar17;
  ptrdiff_t nargs;
  bool bVar18;
  ushort uVar19;
  IRRef1 IVar20;
  uint uVar21;
  code *cont;
  uint uVar22;
  GCtab *pGVar23;
  ulong uVar24;
  
  pTVar8 = &ix->keyv;
  ptr = &J[-1].penalty[0x32].val;
  uVar21 = ix->tab;
  do {
    if ((uVar21 & 0x1f000000) == 0xb000000) {
      dVar5 = pTVar8->n;
      if ((dVar5 == -NAN) || (((ushort)((ulong)dVar5 >> 0x30) < 0xfff9 && (NAN(dVar5))))) {
        if (ix->val != 0) {
          lj_trace_err(J,LJ_TRERR_STORENN);
        }
        if ((ix->key & 0x8000) == 0) {
          if (ix->idxchain == 0) {
            return 0x7fff;
          }
          iVar10 = lj_record_mm_lookup(J,ix,MM_index);
          if (iVar10 == 0) {
            return 0x7fff;
          }
          goto LAB_0014ef24;
        }
      }
      pGVar23 = (GCtab *)((ix->tabv).u64 & 0x7fffffffffff);
      pcVar14 = lj_tab_get(J->L,pGVar23,pTVar8);
      ix->oldv = pcVar14;
      uVar21 = ix->key;
      if ((uVar21 >> 0x18 & 0x1e) - 0xe < 6) {
        dVar5 = pTVar8->n;
        uVar15 = (int)dVar5;
        if ((double)(int)dVar5 != dVar5) {
          uVar15 = 0x8000001;
        }
        if (NAN((double)(int)dVar5) || NAN(dVar5)) {
          uVar15 = 0x8000001;
        }
        if (0x8000000 < uVar15) {
          if ((short)uVar21 < 0) {
            if (pGVar23->asize != 0) {
              lj_trace_err(J,LJ_TRERR_NYITMIX);
            }
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130008;
            TVar12 = lj_opt_fold(J);
            TVar11 = lj_ir_kint(J,0);
            (J->fold).ins.field_0.ot = 0x893;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
            lj_opt_fold(J);
          }
          goto LAB_0014eb39;
        }
        TVar12 = lj_opt_narrow_index(J,uVar21);
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130008;
        TVar11 = lj_opt_fold(J);
        if (pGVar23->asize <= uVar15) {
          (J->fold).ins.field_0.ot = 0x693;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          lj_opt_fold(J);
          if (uVar15 == 0 && (uVar21 & 0x8000) == 0) {
            uVar21 = lj_ir_knum_u64(J,0);
          }
          goto LAB_0014eb39;
        }
        rec_idx_abc(J,TVar11,TVar12,pGVar23->asize);
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090006;
        TVar11 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x3809;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
LAB_0014ec87:
        TVar12 = lj_opt_fold(J);
LAB_0014ecf6:
        uVar15 = 0;
        uVar17 = '\0';
      }
      else {
LAB_0014eb39:
        if (pGVar23->hmask == 0) {
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130009;
          TVar12 = lj_opt_fold(J);
          TVar11 = lj_ir_kint(J,0);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          lj_opt_fold(J);
          TVar12 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          goto LAB_0014ecf6;
        }
        if ((uVar21 >> 0x18 & 0x1f) - 0xf < 5) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar21;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
          uVar21 = lj_opt_fold(J);
        }
        if ((((short)(IRRef1)uVar21 < 0) ||
            (uVar24 = (long)ix->oldv - (pGVar23->node).ptr64, 0x17ffe8 < uVar24)) ||
           ((ulong)pGVar23->hmask * 0x18 < uVar24)) {
          TVar12 = ix->tab;
          (J->fold).ins.field_0.ot = 0x3a09;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar21;
          goto LAB_0014ec87;
        }
        uVar15 = (J->cur).nins;
        uVar17 = (J->guardemit).irt;
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130009;
        TVar12 = lj_opt_fold(J);
        TVar11 = lj_ir_kint(J,pGVar23->hmask);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
        lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090007;
        TVar12 = lj_opt_fold(J);
        TVar11 = lj_ir_kslot(J,uVar21,(IRRef)((uVar24 & 0xffffffff) / 0x18));
        (J->fold).ins.field_0.ot = 0x3989;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
        TVar12 = lj_opt_fold(J);
      }
      IVar20 = (IRRef1)TVar12;
      pIVar6 = (J->cur).ir;
      uVar21 = TVar12 & 0xffff;
      cVar2 = *(char *)((long)pIVar6 + (ulong)uVar21 * 8 + 5);
      if (cVar2 == '\x1a') {
        pcVar14 = *(cTValue **)&pIVar6[(ulong)uVar21 + 1].i;
      }
      else {
        pcVar14 = ix->oldv;
      }
      uVar22 = cVar2 == '8' ^ 0x43;
      uVar3 = ix->val;
      if (uVar3 != 0) {
        pGVar23 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
        uVar4 = ix->key;
        if (uVar21 < uVar15) {
          lj_ir_rollback(J,uVar15);
          (J->guardemit).irt = uVar17;
        }
        if (pcVar14->u64 == 0xffffffffffffffff) {
          if (((ix->idxchain == 0) || (pGVar23 == (GCtab *)0x0)) ||
             ((pcVar13 = lj_tab_getstr(pGVar23,(GCstr *)J[-1].penalty[0x3e].pc.ptr64),
              pcVar13 == (cTValue *)0x0 || (pcVar13->u64 == 0xffffffffffffffff)))) {
            if (cVar2 == ':') {
              uVar19 = (ushort)(pcVar14 != (cTValue *)ptr) << 8 | 0x889;
              TVar12 = lj_ir_kptr_(J,IR_KKPTR,ptr);
              IVar9 = (IRRef1)TVar12;
              goto LAB_0014ee02;
            }
          }
          else {
            uVar19 = (ushort)(uVar22 << 8) | 0x80;
            IVar9 = 0;
LAB_0014ee02:
            (J->fold).ins.field_0.ot = uVar19;
            (J->fold).ins.field_0.op1 = IVar20;
            (J->fold).ins.field_0.op2 = IVar9;
            lj_opt_fold(J);
          }
          if ((ix->idxchain != 0) && (iVar10 = lj_record_mm_lookup(J,ix,MM_newindex), iVar10 != 0))
          goto LAB_0014ef24;
          if (pcVar14 == (cTValue *)ptr) {
            uVar21 = ix->key;
            IVar20 = (IRRef1)uVar21;
            if ((uVar21 >> 0x18 & 0x1f) - 0xf < 5) {
              (J->fold).ins.field_0.op1 = IVar20;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
              uVar21 = lj_opt_fold(J);
            }
            else if (((uVar21 & 0x1f000000) == 0xe000000) && ((short)IVar20 < 0)) {
              (J->fold).ins.field_0.ot = 0x88e;
              (J->fold).ins.field_0.op1 = IVar20;
              (J->fold).ins.field_0.op2 = IVar20;
              lj_opt_fold(J);
            }
            TVar12 = ix->tab;
            (J->fold).ins.field_0.ot = 0x3b09;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
            (J->fold).ins.field_0.op2 = (IRRef1)uVar21;
            TVar12 = lj_opt_fold(J);
            IVar20 = (IRRef1)TVar12;
            bVar18 = false;
          }
          else {
            bVar18 = (uVar3 & 0x1f000000) != 0 && (uVar4 >> 0x18 & 0x1f) - 4 < 9;
          }
        }
        else {
          iVar10 = lj_opt_fwd_wasnonnil(J,(IROpT)uVar22,uVar21);
          if (iVar10 == 0) {
            if (cVar2 == ':') {
              TVar12 = lj_ir_kptr_(J,IR_KKPTR,ptr);
              (J->fold).ins.field_0.ot = 0x989;
              (J->fold).ins.field_0.op1 = IVar20;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
              lj_opt_fold(J);
            }
            bVar18 = (uVar3 & 0x1f000000) != 0 && (uVar4 >> 0x18 & 0x1f) - 4 < 9;
            if (ix->idxchain != 0) {
              if (pGVar23 == (GCtab *)0x0) {
                (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b0005;
                TVar12 = lj_opt_fold(J);
                TVar11 = lj_ir_knull(J,IRT_TAB);
                (J->fold).ins.field_0.ot = 0x88b;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
                lj_opt_fold(J);
              }
              else {
                uVar19 = 0x8e;
                if (0xfffffffffffffff1 < (ulong)(pcVar14->it64 >> 0x2f)) {
                  uVar19 = ~(ushort)(int)(pcVar14->it64 >> 0x2f) | 0x80;
                }
                (J->fold).ins.field_0.ot = uVar19 + (short)(uVar22 << 8);
                (J->fold).ins.field_0.op1 = IVar20;
                (J->fold).ins.field_0.op2 = 0;
                lj_opt_fold(J);
              }
            }
          }
          else {
            bVar18 = false;
          }
        }
        uVar21 = ix->val;
        uVar15 = uVar21 >> 0x18 & 0x1f;
        if (uVar15 - 0xf < 5) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar21;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
          uVar21 = lj_opt_fold(J);
          ix->val = uVar21;
          uVar15 = uVar21 >> 0x18 & 0x1f;
        }
        (J->fold).ins.field_0.ot = (ushort)(uVar22 << 8) | (ushort)uVar15 | 0x800;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar21;
        lj_opt_fold(J);
        if ((bVar18) || ((*(byte *)((long)&ix->val + 3) & 0x1f) - 4 < 9)) {
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x58000000;
          lj_opt_fold(J);
        }
        uVar21 = ix->key;
        if ((uVar21 & 0x1f000000) != 0x4000000) goto LAB_0014f39a;
        if ((short)uVar21 < 0) break;
        lVar16 = 0;
        goto LAB_0014f33c;
      }
      uVar21 = ~(uint)(pcVar14->it64 >> 0x2f);
      if ((ulong)(pcVar14->it64 >> 0x2f) < 0xfffffffffffffff2) {
        uVar21 = 0xe;
      }
      if (pcVar14 == (cTValue *)ptr) {
        TVar12 = lj_ir_kptr_(J,IR_KKPTR,ptr);
        (J->fold).ins.field_0.ot = 0x889;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        lj_opt_fold(J);
        TVar12 = 0x7fff;
      }
      else {
        (J->fold).ins.field_0.ot = (short)uVar21 + (short)(uVar22 << 8) + 0x80;
        (J->fold).ins.field_0.op1 = IVar20;
        (J->fold).ins.field_0.op2 = 0;
        TVar12 = lj_opt_fold(J);
      }
      if ((TVar12 & 0xffff) < uVar15) {
        lj_ir_rollback(J,uVar15);
        (J->guardemit).irt = uVar17;
      }
      if (uVar21 != 0) {
        if (uVar21 < 3) {
          return uVar21 * 0x1000001 ^ 0x7fff;
        }
        return TVar12;
      }
      if (ix->idxchain == 0) {
        return 0x7fff;
      }
      iVar10 = lj_record_mm_lookup(J,ix,MM_index);
      if (iVar10 == 0) {
        return 0x7fff;
      }
    }
    else {
      iVar10 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
      if (iVar10 == 0) {
        lj_trace_err(J,LJ_TRERR_NOMM);
      }
    }
LAB_0014ef24:
    uVar21 = ix->mobj;
    if ((uVar21 & 0x1f000000) == 0x8000000) {
      cont = lj_cont_nop;
      if (ix->val == 0) {
        cont = lj_cont_ra;
      }
      func = rec_mm_prep(J,cont);
      pTVar7 = J->base;
      pTVar8 = J->L->base;
      pTVar7[func] = ix->mobj;
      pTVar7[(ulong)func + 2] = ix->tab;
      pTVar7[(ulong)func + 3] = ix->key;
      pTVar8[func].u64 = (ix->mobjv).u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar8[(ulong)func + 2].gcr.gcptr64 = (uint64_t)ix->tabv;
      pTVar8[(ulong)func + 3] = ix->keyv;
      if (ix->val == 0) {
        nargs = 2;
      }
      else {
        pTVar7[(ulong)func + 4] = ix->val;
        pTVar8[(ulong)func + 4] = ix->valv;
        nargs = 3;
      }
      lj_record_call(J,func,nargs);
      return 0;
    }
    if (((((ix->mt == 0x7fff) && (ix->val == 0)) && ((ix->tab & 0x1f000000) == 0xc000000)) &&
        (((uVar21 & 0x1f000000) == 0xb000000 &&
         (*(char *)(((ix->tabv).u64 & 0x7fffffffffff) + 10) == '\x03')))) &&
       ((ix->key & 0x1f008000) == 0x4000000)) {
      pcVar14 = lj_tab_getstr((GCtab *)((ix->mobjv).u64 & 0x7fffffffffff),
                              (GCstr *)((ix->keyv).u64 & 0x7fffffffffff));
      TVar12 = lj_record_constify(J,pcVar14);
      if (TVar12 != 0) {
        return TVar12;
      }
      uVar21 = ix->mobj;
    }
    ix->tab = uVar21;
    ix->tabv = ix->mobjv;
    piVar1 = &ix->idxchain;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      lj_trace_err(J,LJ_TRERR_IDXLOOP);
    }
  } while( true );
LAB_0014f351:
  (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e09000a;
  TVar12 = lj_opt_fold(J);
  TVar11 = lj_ir_kint(J,0);
  (J->fold).ins.field_0.ot = 0x4d10;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
  lj_opt_fold(J);
  goto LAB_0014f39a;
  while (lVar16 = lVar16 + 1, lVar16 != 6) {
LAB_0014f33c:
    if (*(IRIns *)((long)J + lVar16 * 8 + -0x130) == (J->cur).ir[(ulong)(uVar21 & 0x7fff) + 1])
    goto LAB_0014f351;
  }
LAB_0014f39a:
  J->needsnap = '\x01';
  return 0;
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  IRRef rbref;
  IRType1 rbguard;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lj_assertJ(ix->idxchain != 0, "bad usage");
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func + LJ_FR2;
      TValue *tv = J->L->base + func + LJ_FR2;
      base[-LJ_FR2] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv-LJ_FR2, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
#if LJ_HASBUFFER
    /* The index table of buffer objects is treated as immutable. */
    if (ix->mt == TREF_NIL && !ix->val &&
	tref_isudata(ix->tab) && udataV(&ix->tabv)->udtype == UDTYPE_BUFFER &&
	tref_istab(ix->mobj) && tref_isstr(ix->key) && tref_isk(ix->key)) {
      cTValue *val = lj_tab_getstr(tabV(&ix->mobjv), strV(&ix->keyv));
      TRef tr = lj_record_constify(J, val);
      if (tr) return tr;  /* Specialize to the value, i.e. a method. */
    }
#endif
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix, &rbref, &rbguard);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (tref_ref(res) < rbref) {  /* HREFK + load forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tref_ref(xref) < rbref) {  /* HREFK forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_PGC),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lj_assertJ(hasmm, "inconsistent metamethod handling");
	goto handlemm;
      }
      lj_assertJ(!hasmm, "inconsistent metamethod handling");
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key)) {  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	} else if (tref_isnum(key)) {
	  if (tref_isk(key)) {
	    if (tvismzero(&ix->keyv))
	      key = lj_ir_knum_zero(J);  /* Canonicalize -0.0 to +0.0. */
	  } else {
	    emitir(IRTG(IR_EQ, IRT_NUM), key, key);  /* Check for !NaN. */
	  }
	}
	xref = emitir(IRT(IR_NEWREF, IRT_PGC), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
#ifdef LUAJIT_ENABLE_TABLE_BUMP
	if ((J->flags & JIT_F_OPT_SINK))  /* Avoid a separate flag. */
	  rec_idx_bump(J, ix);
#endif
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_PGC), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}